

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint amount)

{
  uint uVar1;
  PoolEntry *pPVar2;
  ulong uVar3;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar3 = (ulong)uVar1;
  this->Count = amount + uVar1;
  pPVar2 = this->Array + uVar3;
  for (; uVar3 < amount + uVar1; uVar3 = uVar3 + 1) {
    (pPVar2->Str).Chars = (char *)0x7ff1bc;
    pPVar2 = pPVar2 + 1;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}